

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O1

size_t jessilib::starts_with_lengthi<char32_t,char>
                 (basic_string_view<char32_t,_std::char_traits<char32_t>_> in_string,
                 basic_string_view<char,_std::char_traits<char>_> in_prefix)

{
  wchar32 wVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  jessilib *this;
  wchar32 *pwVar7;
  size_t sVar8;
  decode_result dVar9;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  size_t local_38;
  
  pwVar7 = in_string._M_str;
  sVar8 = in_string._M_len;
  pcVar5 = in_prefix._M_str;
  this = (jessilib *)in_prefix._M_len;
  local_38 = 0;
  do {
    if ((sVar8 == 0) || (this == (jessilib *)0x0)) {
      if (this != (jessilib *)0x0) {
        return 0;
      }
      return local_38;
    }
    wVar1 = *pwVar7;
    in_string_00._M_str = (char *)this;
    in_string_00._M_len = (size_t)pcVar5;
    dVar9 = decode_codepoint_utf8<char>(this,in_string_00);
    sVar6 = dVar9.units;
    if (sVar6 == 0) {
LAB_00274dbd:
      bVar2 = false;
    }
    else {
      if (wVar1 != dVar9.codepoint) {
        iVar3 = jessilib::fold(wVar1);
        iVar4 = jessilib::fold(dVar9.codepoint);
        if (iVar3 != iVar4) goto LAB_00274dbd;
      }
      pwVar7 = pwVar7 + 1;
      sVar8 = sVar8 - 1;
      pcVar5 = pcVar5 + sVar6;
      this = this + -sVar6;
      local_38 = local_38 + 1;
      bVar2 = true;
    }
    if (!bVar2) {
      return 0;
    }
  } while( true );
}

Assistant:

size_t starts_with_lengthi(std::basic_string_view<LhsCharT> in_string, std::basic_string_view<RhsCharT> in_prefix) {
	// If in_string and in_prefix are the same type, skip decoding each point
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (in_string.size() < in_prefix.size()) {
			return 0;
		}
	}

	size_t codepoints_removed{};
	while (!in_string.empty() && !in_prefix.empty()) {
		decode_result string_front = decode_codepoint(in_string);
		decode_result prefix_front = decode_codepoint(in_prefix);

		if (string_front.units == 0
			|| prefix_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return 0;
		}

		if (!equalsi(string_front.codepoint, prefix_front.codepoint)) {
			// Codepoints don't fold to same value
			return 0;
		}

		// Codepoints are equal; trim off the fronts and continue
		in_string.remove_prefix(string_front.units);
		in_prefix.remove_prefix(prefix_front.units);
		codepoints_removed += string_front.units;
	}

	if (!in_prefix.empty()) {
		// We reached end of in_string before end of prefix
		return 0;
	}

	return codepoints_removed;
}